

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  bool bVar1;
  pointer pcVar2;
  ostream *poVar3;
  reference pbVar4;
  string *path;
  reference key;
  char *pcVar5;
  char *helpString;
  string local_318;
  reference local_2f8;
  SaveCacheEntry *i_1;
  iterator __end1;
  iterator __begin1;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *__range1;
  string local_2d0;
  char *local_2b0;
  char *help;
  char *existingValue;
  undefined1 local_298 [8];
  SaveCacheEntry save;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  iterator i;
  ostringstream warning;
  undefined1 local_a8 [8];
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsSplit;
  string *var_local;
  cmake *this_local;
  
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = var;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  std::__cxx11::string::string
            ((string *)&local_58,
             (string *)
             argsSplit.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmSystemTools::ExpandListArgument
            (&local_58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,true);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",
             (allocator<char> *)
             ((long)&saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmState::SetGlobalProperty(pcVar2,&local_88,"");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  bVar1 = cmState::GetIsInTryCompile(pcVar2);
  if (bVar1) {
    this_local._4_4_ = 0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::vector
              ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_a8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
    poVar3 = std::operator<<((ostream *)&i,
                             "You have changed variables that require your cache to be deleted.\n");
    poVar3 = std::operator<<(poVar3,
                             "Configure will be re-run and you may have to reset some variables.\n")
    ;
    std::operator<<(poVar3,"The following variables have changed:\n");
    local_228._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38);
    while( true ) {
      save._96_8_ = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38);
      bVar1 = __gnu_cxx::operator!=
                        (&local_228,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&save.type);
      if (!bVar1) break;
      SaveCacheEntry::SaveCacheEntry((SaveCacheEntry *)local_298);
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_228);
      std::__cxx11::string::operator=((string *)local_298,(string *)pbVar4);
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_228);
      poVar3 = std::operator<<((ostream *)&i,(string *)pbVar4);
      std::operator<<(poVar3,"= ");
      existingValue =
           (char *)__gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++(&local_228,0);
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_228);
      std::__cxx11::string::operator=
                ((string *)(save.key.field_2._M_local_buf + 8),(string *)pbVar4);
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_228);
      poVar3 = std::operator<<((ostream *)&i,(string *)pbVar4);
      std::operator<<(poVar3,"\n");
      pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      help = cmState::GetCacheEntryValue(pcVar2,(string *)local_298);
      if (help != (char *)0x0) {
        pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        save.help.field_2._8_4_ = cmState::GetCacheEntryType(pcVar2,(string *)local_298);
        pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"HELPSTRING",(allocator<char> *)((long)&__range1 + 7));
        pcVar5 = cmState::GetCacheEntryProperty(pcVar2,(string *)local_298,&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        local_2b0 = pcVar5;
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::string::operator=((string *)(save.value.field_2._M_local_buf + 8),pcVar5);
        }
      }
      std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::push_back
                ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_a8,
                 (value_type *)local_298);
      SaveCacheEntry::~SaveCacheEntry((SaveCacheEntry *)local_298);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_228);
    }
    path = GetHomeOutputDirectory_abi_cxx11_(this);
    DeleteCache(this,path);
    LoadCache(this);
    __end1 = std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::begin
                       ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_a8);
    i_1 = (SaveCacheEntry *)
          std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::end
                    ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_a8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
                                       *)&i_1), bVar1) {
      key = __gnu_cxx::
            __normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
            ::operator*(&__end1);
      local_2f8 = key;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      helpString = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&key->key,pcVar5,helpString,local_2f8->type);
      __gnu_cxx::
      __normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::ostringstream::str();
    cmSystemTools::Message(&local_318,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_318);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = Configure(this);
    }
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector
              ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_a8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  std::vector<std::string> argsSplit;
  cmSystemTools::ExpandListArgument(std::string(var), argsSplit, true);
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->State->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  /* clang-format off */
  warning
    << "You have changed variables that require your cache to be deleted.\n"
    << "Configure will be re-run and you may have to reset some variables.\n"
    << "The following variables have changed:\n";
  /* clang-format on */
  for (std::vector<std::string>::iterator i = argsSplit.begin();
       i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    save.value = *i;
    warning << *i << "\n";
    const char* existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (const char* help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = help;
      }
    }
    saved.push_back(std::move(save));
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (SaveCacheEntry const& i : saved) {
    this->AddCacheEntry(i.key, i.value.c_str(), i.help.c_str(), i.type);
  }
  cmSystemTools::Message(warning.str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccuredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}